

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O2

void MOJOSHADER_glEffectCommitChanges(MOJOSHADER_glEffect *glEffect)

{
  uint uVar1;
  MOJOSHADER_effectParam *pMVar2;
  MOJOSHADER_effectStateChanges *pMVar3;
  MOJOSHADER_preshader *pMVar4;
  bool bVar5;
  long lVar6;
  int iVar7;
  MOJOSHADER_effectObject *pMVar8;
  ulong uVar9;
  ulong uVar10;
  MOJOSHADER_effectObject *pMVar11;
  float selector;
  float local_34;
  
  pMVar11 = (MOJOSHADER_effectObject *)glEffect->current_vert_raw;
  pMVar8 = (MOJOSHADER_effectObject *)glEffect->current_frag_raw;
  bVar5 = true;
  if (pMVar11 == (MOJOSHADER_effectObject *)0x0) {
    pMVar11 = (MOJOSHADER_effectObject *)0x0;
  }
  else if (*(uint *)((long)pMVar11 + 0xc) != 0) {
    uVar9 = 0;
    do {
      uVar1 = (*(uint **)((long)pMVar11 + 0x18))[uVar9];
      pMVar2 = glEffect->effect->params;
      iVar7 = 0;
      for (uVar10 = 0; uVar10 < pMVar2[uVar1].value.value_count >> 2; uVar10 = uVar10 + 1) {
        memcpy(((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)((long)pMVar11 + 0x40))->
               preshader->registers +
               ((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)((long)pMVar11 + 0x40))->
               preshader->symbols[uVar9].register_index + uVar10,
               (void *)((long)iVar7 * 4 + (long)pMVar2[uVar1].value.field_4.values),
               (ulong)(pMVar2[uVar1].value.type.columns << 2));
        iVar7 = iVar7 + 4;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < ((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)
                     ((long)pMVar11 + 0x40))->preshader->symbol_count);
    MOJOSHADER_runPreshader
              (((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)((long)pMVar11 + 0x40))->
               preshader,&local_34);
    uVar1 = *(uint *)((long)glEffect->effect->params[**(uint **)((long)pMVar11 + 0x28)].value.
                            field_4.values + (long)(int)local_34 * 4);
    pMVar11 = glEffect->effect->objects + (int)uVar1;
    lVar6 = 0;
    uVar9 = 0;
    do {
      if (uVar1 == glEffect->shader_indices[uVar9]) {
        glEffect->current_vert =
             (MOJOSHADER_glShader *)((long)&glEffect->shaders->parseData + lVar6);
        break;
      }
      uVar9 = uVar9 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar9 < glEffect->num_shaders);
    bVar5 = false;
  }
  if ((pMVar8 == (MOJOSHADER_effectObject *)0x0) || (*(uint *)((long)pMVar8 + 0xc) == 0)) {
    if (bVar5) goto LAB_00120756;
  }
  else {
    uVar9 = 0;
    do {
      uVar1 = (*(uint **)((long)pMVar8 + 0x18))[uVar9];
      pMVar2 = glEffect->effect->params;
      iVar7 = 0;
      for (uVar10 = 0; uVar10 < pMVar2[uVar1].value.value_count >> 2; uVar10 = uVar10 + 1) {
        memcpy(((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)((long)pMVar8 + 0x40))->
               preshader->registers +
               ((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)((long)pMVar8 + 0x40))->
               preshader->symbols[uVar9].register_index + uVar10,
               (void *)((long)iVar7 * 4 + (long)pMVar2[uVar1].value.field_4.values),
               (ulong)(pMVar2[uVar1].value.type.columns << 2));
        iVar7 = iVar7 + 4;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < ((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)
                     ((long)pMVar8 + 0x40))->preshader->symbol_count);
    MOJOSHADER_runPreshader
              (((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)((long)pMVar8 + 0x40))->
               preshader,&local_34);
    uVar1 = *(uint *)((long)glEffect->effect->params[**(uint **)((long)pMVar8 + 0x28)].value.field_4
                            .values + (long)(int)local_34 * 4);
    pMVar8 = glEffect->effect->objects + (int)uVar1;
    lVar6 = 0;
    uVar9 = 0;
    do {
      if (uVar1 == glEffect->shader_indices[uVar9]) {
        glEffect->current_frag =
             (MOJOSHADER_glShader *)((long)&glEffect->shaders->parseData + lVar6);
        break;
      }
      uVar9 = uVar9 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar9 < glEffect->num_shaders);
  }
  MOJOSHADER_glBindShaders(glEffect->current_vert,glEffect->current_frag);
  if (glEffect->current_vert_raw != (MOJOSHADER_effectShader *)0x0) {
    pMVar3 = glEffect->effect->state_changes;
    pMVar3->vertex_sampler_state_changes =
         *(MOJOSHADER_samplerStateRegister **)((long)pMVar11 + 0x38);
    pMVar3->vertex_sampler_state_change_count = *(uint *)((long)pMVar11 + 0x30);
  }
  if (glEffect->current_frag_raw != (MOJOSHADER_effectShader *)0x0) {
    pMVar3 = glEffect->effect->state_changes;
    pMVar3->sampler_state_changes = *(MOJOSHADER_samplerStateRegister **)((long)pMVar8 + 0x38);
    pMVar3->sampler_state_change_count = *(uint *)((long)pMVar8 + 0x30);
  }
LAB_00120756:
  if (pMVar11 != (MOJOSHADER_effectObject *)0x0) {
    copy_parameter_data(glEffect->effect->params,*(uint **)((long)pMVar11 + 0x28),
                        ((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)
                        ((long)pMVar11 + 0x40))->shader->symbols,
                        ((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)
                        ((long)pMVar11 + 0x40))->shader->symbol_count,ctx->vs_reg_file_f,
                        ctx->vs_reg_file_i,ctx->vs_reg_file_b);
    pMVar4 = ((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)((long)pMVar11 + 0x40))->
             shader->preshader;
    if (pMVar4 != (MOJOSHADER_preshader *)0x0) {
      copy_parameter_data(glEffect->effect->params,*(uint **)((long)pMVar11 + 0x18),pMVar4->symbols,
                          pMVar4->symbol_count,pMVar4->registers,(GLint *)0x0,(uint8 *)0x0);
      MOJOSHADER_runPreshader
                (((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)((long)pMVar11 + 0x40))
                 ->shader->preshader,ctx->vs_reg_file_f);
    }
  }
  if (pMVar8 != (MOJOSHADER_effectObject *)0x0) {
    copy_parameter_data(glEffect->effect->params,*(uint **)((long)pMVar8 + 0x28),
                        ((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)
                        ((long)pMVar8 + 0x40))->shader->symbols,
                        ((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)
                        ((long)pMVar8 + 0x40))->shader->symbol_count,ctx->ps_reg_file_f,
                        ctx->ps_reg_file_i,ctx->ps_reg_file_b);
    pMVar4 = ((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)((long)pMVar8 + 0x40))->
             shader->preshader;
    if (pMVar4 != (MOJOSHADER_preshader *)0x0) {
      copy_parameter_data(glEffect->effect->params,*(uint **)((long)pMVar8 + 0x18),pMVar4->symbols,
                          pMVar4->symbol_count,pMVar4->registers,(GLint *)0x0,(uint8 *)0x0);
      MOJOSHADER_runPreshader
                (((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)((long)pMVar8 + 0x40))->
                 shader->preshader,ctx->ps_reg_file_f);
    }
  }
  ctx->generation = ctx->generation + 1;
  return;
}

Assistant:

void MOJOSHADER_glEffectCommitChanges(MOJOSHADER_glEffect *glEffect)
{
    MOJOSHADER_effectShader *rawVert = glEffect->current_vert_raw;
    MOJOSHADER_effectShader *rawFrag = glEffect->current_frag_raw;

    /* Used for shader selection from preshaders */
    int i, j;
    MOJOSHADER_effectValue *param;
    float selector;
    int shader_object;
    int selector_ran = 0;

    /* For effect passes with arrays of shaders, we have to run a preshader
     * that determines which shader to use, based on a parameter's value.
     * -flibit
     */
    // !!! FIXME: We're just running the preshaders every time. Blech. -flibit
    #define SELECT_SHADER_FROM_PRESHADER(raw, gls) \
        if (raw != NULL && raw->is_preshader) \
        { \
            i = 0; \
            do \
            { \
                param = &glEffect->effect->params[raw->preshader_params[i]].value; \
                for (j = 0; j < (param->value_count >> 2); j++) \
                    memcpy(raw->preshader->registers + raw->preshader->symbols[i].register_index + j, \
                           param->valuesI + (j << 2), \
                           param->type.columns << 2); \
            } while (++i < raw->preshader->symbol_count); \
            MOJOSHADER_runPreshader(raw->preshader, &selector); \
            shader_object = glEffect->effect->params[raw->params[0]].value.valuesI[(int) selector]; \
            raw = &glEffect->effect->objects[shader_object].shader; \
            i = 0; \
            do \
            { \
                if (shader_object == glEffect->shader_indices[i]) \
                { \
                    gls = &glEffect->shaders[i]; \
                    break; \
                } \
            } while (++i < glEffect->num_shaders); \
            selector_ran = 1; \
        }
    SELECT_SHADER_FROM_PRESHADER(rawVert, glEffect->current_vert)
    SELECT_SHADER_FROM_PRESHADER(rawFrag, glEffect->current_frag)
    #undef SELECT_SHADER_FROM_PRESHADER
    if (selector_ran)
    {
        MOJOSHADER_glBindShaders(glEffect->current_vert,
                                 glEffect->current_frag);
        if (glEffect->current_vert_raw != NULL)
        {
            glEffect->effect->state_changes->vertex_sampler_state_changes = rawVert->samplers;
            glEffect->effect->state_changes->vertex_sampler_state_change_count = rawVert->sampler_count;
        } // if
        if (glEffect->current_frag_raw != NULL)
        {
            glEffect->effect->state_changes->sampler_state_changes = rawFrag->samplers;
            glEffect->effect->state_changes->sampler_state_change_count = rawFrag->sampler_count;
        } // if
    } // if

    /* This is where parameters are copied into the constant buffers.
     * If you're looking for where things slow down immensely, look at
     * the copy_parameter_data() and MOJOSHADER_runPreshader() functions.
     * -flibit
     */
    // !!! FIXME: We're just copying everything every time. Blech. -flibit
    // !!! FIXME: We're just running the preshaders every time. Blech. -flibit
    // !!! FIXME: Will the preshader ever want int/bool registers? -flibit
    #define COPY_PARAMETER_DATA(raw, stage) \
        if (raw != NULL) \
        { \
            copy_parameter_data(glEffect->effect->params, raw->params, \
                                raw->shader->symbols, \
                                raw->shader->symbol_count, \
                                ctx->stage##_reg_file_f, \
                                ctx->stage##_reg_file_i, \
                                ctx->stage##_reg_file_b); \
            if (raw->shader->preshader) \
            { \
                copy_parameter_data(glEffect->effect->params, raw->preshader_params, \
                                    raw->shader->preshader->symbols, \
                                    raw->shader->preshader->symbol_count, \
                                    raw->shader->preshader->registers, \
                                    NULL, \
                                    NULL); \
                MOJOSHADER_runPreshader(raw->shader->preshader, ctx->stage##_reg_file_f); \
            } \
        }
    COPY_PARAMETER_DATA(rawVert, vs)
    COPY_PARAMETER_DATA(rawFrag, ps)
    #undef COPY_PARAMETER_DATA

    ctx->generation++;
}